

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  size_t sVar1;
  void *alloc;
  long lVar2;
  long lVar3;
  ZSTD_cwksp local_70;
  
  lVar3 = 4L << ((byte)cParams.chainLog & 0x3f);
  if (cParams.strategy == ZSTD_fast) {
    lVar3 = 0;
  }
  lVar2 = (dictSize + 7 & 0xfffffffffffffff8) + 0x2b40;
  if (dictLoadMethod == ZSTD_dlm_byRef) {
    lVar2 = 0x2b40;
  }
  if (((ulong)workspace & 7) == 0) {
    local_70.workspaceEnd = (void *)((long)workspace + workspaceSize);
    local_70.phase = ZSTD_cwksp_alloc_objects;
    local_70.allocFailed = 0;
    local_70.workspace = workspace;
    local_70.objectEnd = workspace;
    local_70.tableEnd = workspace;
    local_70.tableValidEnd = workspace;
    local_70.allocStart = local_70.workspaceEnd;
    ZSTD_cwksp_assert_internal_consistency(&local_70);
    local_70.workspaceOversizedDuration = 0;
    ZSTD_cwksp_assert_internal_consistency(&local_70);
    ZSTD_cwksp_assert_internal_consistency(&local_70);
    if ((0x133f < (long)workspaceSize) &&
       (local_70.objectEnd = (void *)((long)workspace + 0x1340), workspace != (void *)0x0)) {
      *(void **)((long)workspace + 0x38) = local_70.objectEnd;
      *(void **)((long)workspace + 0x40) = local_70.allocStart;
      *(ulong *)((long)workspace + 0x48) =
           CONCAT44(local_70.workspaceOversizedDuration,local_70.allocFailed);
      *(ulong *)((long)workspace + 0x50) = CONCAT44(local_70._60_4_,local_70.phase);
      *(void **)((long)workspace + 0x18) = local_70.workspace;
      *(void **)((long)workspace + 0x20) = local_70.workspaceEnd;
      *(void **)((long)workspace + 0x28) = local_70.objectEnd;
      *(void **)((long)workspace + 0x30) = local_70.objectEnd;
      if ((ulong)(lVar3 + lVar2 + (4L << ((byte)cParams.hashLog & 0x3f))) <= workspaceSize) {
        local_70.tableEnd = local_70.objectEnd;
        local_70.tableValidEnd = local_70.objectEnd;
        sVar1 = ZSTD_initCDict_internal
                          ((ZSTD_CDict *)workspace,dict,dictSize,dictLoadMethod,dictContentType,
                           cParams);
        if (sVar1 < 0xffffffffffffff89) {
          return (ZSTD_CDict *)workspace;
        }
        return (ZSTD_CDict *)0x0;
      }
    }
  }
  return (ZSTD_CDict *)0x0;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}